

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

bool xatlas::internal::meshCloseHoles
               (Mesh *mesh,Array<unsigned_int> *boundaryLoops,Vector3 *normal,uint32_t *holeCount,
               Array<unsigned_int> *holeFaceCounts)

{
  bool bVar1;
  uint32_t newSize;
  uint32_t uVar2;
  uint *puVar3;
  float *pfVar4;
  Vector3 *pVVar5;
  Vector3 *pVVar6;
  float fVar7;
  Vector3 VVar8;
  uint local_12c;
  uint32_t local_128;
  uint32_t local_124;
  uint32_t oldFaceCount;
  uint32_t vertex;
  BoundaryLoopEdgeIterator it_1;
  uint32_t local_108;
  uint32_t e;
  uint32_t i_2;
  bool result;
  Array<xatlas::internal::Vector3> holePoints;
  Array<unsigned_int> holeVertices;
  float local_c8;
  uint32_t i_1;
  float maxLength;
  uint32_t diskBoundary;
  Vector3 local_b0;
  Vector3 *local_a0;
  Vector3 *t1;
  Vector3 *t0;
  BoundaryLoopEdgeIterator it;
  uint32_t local_78;
  float boundaryLength;
  uint32_t i;
  undefined1 local_68 [8];
  Array<unsigned_int> boundaryEdgeCounts;
  Array<float> boundaryLengths;
  uint32_t boundaryCount;
  Array<unsigned_int> *holeFaceCounts_local;
  uint32_t *holeCount_local;
  Vector3 *normal_local;
  Array<unsigned_int> *boundaryLoops_local;
  Mesh *mesh_local;
  
  if (holeFaceCounts != (Array<unsigned_int> *)0x0) {
    Array<unsigned_int>::clear(holeFaceCounts);
  }
  newSize = Array<unsigned_int>::size(boundaryLoops);
  Array<float>::Array((Array<float> *)&boundaryEdgeCounts.m_base.capacity,0);
  Array<unsigned_int>::Array((Array<unsigned_int> *)local_68,0);
  Array<unsigned_int>::resize((Array<unsigned_int> *)local_68,newSize);
  for (local_78 = 0; local_78 < newSize; local_78 = local_78 + 1) {
    it.m_current = 0;
    puVar3 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_68,local_78);
    *puVar3 = 0;
    puVar3 = Array<unsigned_int>::operator[](boundaryLoops,local_78);
    Mesh::BoundaryLoopEdgeIterator::BoundaryLoopEdgeIterator
              ((BoundaryLoopEdgeIterator *)&t0,mesh,*puVar3);
    while (bVar1 = Mesh::BoundaryLoopEdgeIterator::isDone((BoundaryLoopEdgeIterator *)&t0),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      uVar2 = Mesh::BoundaryLoopEdgeIterator::edge((BoundaryLoopEdgeIterator *)&t0);
      uVar2 = meshEdgeIndex0(uVar2);
      uVar2 = Mesh::vertexAt(mesh,uVar2);
      t1 = Mesh::position(mesh,uVar2);
      uVar2 = Mesh::BoundaryLoopEdgeIterator::edge((BoundaryLoopEdgeIterator *)&t0);
      uVar2 = meshEdgeIndex1(uVar2);
      uVar2 = Mesh::vertexAt(mesh,uVar2);
      local_a0 = Mesh::position(mesh,uVar2);
      VVar8 = operator-(local_a0,t1);
      local_b0.z = VVar8.z;
      local_b0._0_8_ = VVar8._0_8_;
      fVar7 = length(&local_b0);
      it.m_current = (uint32_t)((float)it.m_current + fVar7);
      puVar3 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_68,local_78);
      *puVar3 = *puVar3 + 1;
      Mesh::BoundaryLoopEdgeIterator::advance((BoundaryLoopEdgeIterator *)&t0);
    }
    Array<float>::push_back
              ((Array<float> *)&boundaryEdgeCounts.m_base.capacity,(float *)&it.m_current);
  }
  i_1 = 0;
  pfVar4 = Array<float>::operator[]((Array<float> *)&boundaryEdgeCounts.m_base.capacity,0);
  local_c8 = *pfVar4;
  for (holeVertices.m_base._20_4_ = 1; (uint)holeVertices.m_base._20_4_ < newSize;
      holeVertices.m_base._20_4_ = holeVertices.m_base._20_4_ + 1) {
    pfVar4 = Array<float>::operator[]
                       ((Array<float> *)&boundaryEdgeCounts.m_base.capacity,
                        holeVertices.m_base._20_4_);
    if (local_c8 < *pfVar4) {
      pfVar4 = Array<float>::operator[]
                         ((Array<float> *)&boundaryEdgeCounts.m_base.capacity,
                          holeVertices.m_base._20_4_);
      local_c8 = *pfVar4;
      i_1 = holeVertices.m_base._20_4_;
    }
  }
  Array<unsigned_int>::Array((Array<unsigned_int> *)&holePoints.m_base.capacity,0);
  Array<xatlas::internal::Vector3>::Array((Array<xatlas::internal::Vector3> *)&i_2,0);
  e._3_1_ = true;
  for (local_108 = 0; local_108 < newSize; local_108 = local_108 + 1) {
    if (i_1 != local_108) {
      puVar3 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_68,local_108);
      Array<unsigned_int>::resize((Array<unsigned_int> *)&holePoints.m_base.capacity,*puVar3);
      puVar3 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_68,local_108);
      Array<xatlas::internal::Vector3>::resize((Array<xatlas::internal::Vector3> *)&i_2,*puVar3);
      it_1.m_current = 0;
      puVar3 = Array<unsigned_int>::operator[](boundaryLoops,local_108);
      Mesh::BoundaryLoopEdgeIterator::BoundaryLoopEdgeIterator
                ((BoundaryLoopEdgeIterator *)&oldFaceCount,mesh,*puVar3);
      while (bVar1 = Mesh::BoundaryLoopEdgeIterator::isDone
                               ((BoundaryLoopEdgeIterator *)&oldFaceCount),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        uVar2 = Mesh::BoundaryLoopEdgeIterator::edge((BoundaryLoopEdgeIterator *)&oldFaceCount);
        uVar2 = meshEdgeIndex0(uVar2);
        uVar2 = Mesh::vertexAt(mesh,uVar2);
        local_124 = uVar2;
        puVar3 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_68,local_108);
        puVar3 = Array<unsigned_int>::operator[]
                           ((Array<unsigned_int> *)&holePoints.m_base.capacity,
                            ~it_1.m_current + *puVar3);
        *puVar3 = uVar2;
        pVVar5 = Mesh::position(mesh,local_124);
        puVar3 = Array<unsigned_int>::operator[]((Array<unsigned_int> *)local_68,local_108);
        pVVar6 = Array<xatlas::internal::Vector3>::operator[]
                           ((Array<xatlas::internal::Vector3> *)&i_2,(*puVar3 - 1) - it_1.m_current)
        ;
        fVar7 = pVVar5->y;
        pVVar6->x = pVVar5->x;
        pVVar6->y = fVar7;
        pVVar6->z = pVVar5->z;
        it_1.m_current = it_1.m_current + 1;
        Mesh::BoundaryLoopEdgeIterator::advance((BoundaryLoopEdgeIterator *)&oldFaceCount);
      }
      local_128 = Mesh::faceCount(mesh);
      bVar1 = meshCloseHole(mesh,(Array<unsigned_int> *)&holePoints.m_base.capacity,normal);
      if (!bVar1) {
        e._3_1_ = false;
      }
      if (holeCount != (uint32_t *)0x0) {
        *holeCount = *holeCount + 1;
      }
      if (holeFaceCounts != (Array<unsigned_int> *)0x0) {
        uVar2 = Mesh::faceCount(mesh);
        local_12c = uVar2 - local_128;
        Array<unsigned_int>::push_back(holeFaceCounts,&local_12c);
      }
    }
  }
  Array<xatlas::internal::Vector3>::~Array((Array<xatlas::internal::Vector3> *)&i_2);
  Array<unsigned_int>::~Array((Array<unsigned_int> *)&holePoints.m_base.capacity);
  Array<unsigned_int>::~Array((Array<unsigned_int> *)local_68);
  Array<float>::~Array((Array<float> *)&boundaryEdgeCounts.m_base.capacity);
  return e._3_1_;
}

Assistant:

static bool meshCloseHoles(Mesh *mesh, const Array<uint32_t> &boundaryLoops, const Vector3 &normal, uint32_t *holeCount, Array<uint32_t> *holeFaceCounts)
{
	if (holeFaceCounts)
		holeFaceCounts->clear();
	// Compute lengths.
	const uint32_t boundaryCount = boundaryLoops.size();
	Array<float> boundaryLengths;
	Array<uint32_t> boundaryEdgeCounts;
	boundaryEdgeCounts.resize(boundaryCount);
	for (uint32_t i = 0; i < boundaryCount; i++) {
		float boundaryLength = 0.0f;
		boundaryEdgeCounts[i] = 0;
		for (Mesh::BoundaryLoopEdgeIterator it(mesh, boundaryLoops[i]); !it.isDone(); it.advance()) {
			const Vector3 &t0 = mesh->position(mesh->vertexAt(meshEdgeIndex0(it.edge())));
			const Vector3 &t1 = mesh->position(mesh->vertexAt(meshEdgeIndex1(it.edge())));
			boundaryLength += length(t1 - t0);
			boundaryEdgeCounts[i]++;
		}
		boundaryLengths.push_back(boundaryLength);
	}
	// Find disk boundary.
	uint32_t diskBoundary = 0;
	float maxLength = boundaryLengths[0];
	for (uint32_t i = 1; i < boundaryCount; i++) {
		if (boundaryLengths[i] > maxLength) {
			maxLength = boundaryLengths[i];
			diskBoundary = i;
		}
	}
	// Close holes.
	Array<uint32_t> holeVertices;
	Array<Vector3> holePoints;
	bool result = true;
	for (uint32_t i = 0; i < boundaryCount; i++) {
		if (diskBoundary == i)
			continue; // Skip disk boundary.
		holeVertices.resize(boundaryEdgeCounts[i]);
		holePoints.resize(boundaryEdgeCounts[i]);
		// Winding is backwards for internal boundaries.
		uint32_t e = 0;
		for (Mesh::BoundaryLoopEdgeIterator it(mesh, boundaryLoops[i]); !it.isDone(); it.advance()) {
			const uint32_t vertex = mesh->vertexAt(meshEdgeIndex0(it.edge()));
			holeVertices[boundaryEdgeCounts[i] - 1 - e] = vertex;
			holePoints[boundaryEdgeCounts[i] - 1 - e] = mesh->position(vertex);
			e++;
		}
		const uint32_t oldFaceCount = mesh->faceCount();
		if (!meshCloseHole(mesh, holeVertices, normal))
			result = false; // Return false if any hole failed to close, but keep trying to close other holes.
		if (holeCount)
			(*holeCount)++;
		if (holeFaceCounts)
			holeFaceCounts->push_back(mesh->faceCount() - oldFaceCount);
	}
	return result;
}